

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_client.c
# Opt level: O0

int main(void)

{
  char *custom;
  int iVar1;
  size_t len;
  undefined1 local_ad8 [8];
  mbedtls_ssl_config conf;
  mbedtls_ssl_context ssl;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_x509_crt ca;
  sockaddr_in addr;
  mbedtls_net_context server_fd;
  int ret;
  
  addr.sin_zero[4] = '\0';
  addr.sin_zero[5] = '\0';
  addr.sin_zero[6] = '\0';
  addr.sin_zero[7] = '\0';
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4));
  mbedtls_net_init((mbedtls_net_context *)addr.sin_zero);
  mbedtls_ssl_init((mbedtls_ssl_context *)&conf.max_major_ver);
  mbedtls_ssl_config_init((mbedtls_ssl_config *)local_ad8);
  mbedtls_x509_crt_init((mbedtls_x509_crt *)&entropy.source[0x13].strong);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  custom = pers;
  len = strlen(pers);
  iVar1 = mbedtls_ctr_drbg_seed
                    ((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4),mbedtls_entropy_func,
                     &ctr_drbg.p_entropy,(uchar *)custom,len);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ssl_config_defaults((mbedtls_ssl_config *)local_ad8,0,0,0);
    if (iVar1 == 0) {
      mbedtls_ssl_conf_rng
                ((mbedtls_ssl_config *)local_ad8,mbedtls_ctr_drbg_random,ssl.peer_verify_data + 4);
      mbedtls_ssl_conf_psk((mbedtls_ssl_config *)local_ad8,"",0x10,(uchar *)"Client_identity",0xf);
      iVar1 = mbedtls_x509_crt_parse_der
                        ((mbedtls_x509_crt *)&entropy.source[0x13].strong,ca_cert,0x256);
      if (iVar1 == 0) {
        mbedtls_ssl_conf_ca_chain
                  ((mbedtls_ssl_config *)local_ad8,(mbedtls_x509_crt *)&entropy.source[0x13].strong,
                   (mbedtls_x509_crl *)0x0);
        mbedtls_ssl_conf_authmode((mbedtls_ssl_config *)local_ad8,2);
        iVar1 = mbedtls_ssl_setup((mbedtls_ssl_context *)&conf.max_major_ver,
                                  (mbedtls_ssl_config *)local_ad8);
        if (iVar1 == 0) {
          iVar1 = mbedtls_ssl_set_hostname((mbedtls_ssl_context *)&conf.max_major_ver,"localhost");
          if (iVar1 == 0) {
            memset((void *)((long)&ca.next + 4),0,0x10);
            ca.next._4_2_ = 2;
            ca.next._6_2_ = 0x5111;
            addr.sin_zero[4] = '\0';
            addr.sin_zero[5] = '\0';
            addr.sin_zero[6] = '\0';
            addr.sin_zero[7] = '\0';
            addr.sin_zero._0_4_ = socket(2,1,0);
            if ((int)addr.sin_zero._0_4_ < 0) {
              addr.sin_zero[4] = '\x05';
              addr.sin_zero[5] = '\0';
              addr.sin_zero[6] = '\0';
              addr.sin_zero[7] = '\0';
            }
            else {
              iVar1 = connect(addr.sin_zero._0_4_,(sockaddr *)((long)&ca.next + 4),0x10);
              if (iVar1 < 0) {
                addr.sin_zero[4] = '\x06';
                addr.sin_zero[5] = '\0';
                addr.sin_zero[6] = '\0';
                addr.sin_zero[7] = '\0';
              }
              else {
                mbedtls_ssl_set_bio((mbedtls_ssl_context *)&conf.max_major_ver,addr.sin_zero,
                                    mbedtls_net_send,mbedtls_net_recv,
                                    (mbedtls_ssl_recv_timeout_t *)0x0);
                iVar1 = mbedtls_ssl_handshake((mbedtls_ssl_context *)&conf.max_major_ver);
                if (iVar1 == 0) {
                  iVar1 = mbedtls_ssl_write((mbedtls_ssl_context *)&conf.max_major_ver,
                                            (uchar *)"GET / HTTP/1.0\r\n\r\n",0x12);
                  if (iVar1 < 1) {
                    addr.sin_zero[4] = '\t';
                    addr.sin_zero[5] = '\0';
                    addr.sin_zero[6] = '\0';
                    addr.sin_zero[7] = '\0';
                  }
                  else {
                    mbedtls_ssl_close_notify((mbedtls_ssl_context *)&conf.max_major_ver);
                  }
                }
                else {
                  addr.sin_zero[4] = '\b';
                  addr.sin_zero[5] = '\0';
                  addr.sin_zero[6] = '\0';
                  addr.sin_zero[7] = '\0';
                }
              }
            }
          }
          else {
            addr.sin_zero[4] = '\x04';
            addr.sin_zero[5] = '\0';
            addr.sin_zero[6] = '\0';
            addr.sin_zero[7] = '\0';
          }
        }
        else {
          addr.sin_zero[4] = '\x03';
          addr.sin_zero[5] = '\0';
          addr.sin_zero[6] = '\0';
          addr.sin_zero[7] = '\0';
        }
      }
      else {
        addr.sin_zero[4] = '\a';
        addr.sin_zero[5] = '\0';
        addr.sin_zero[6] = '\0';
        addr.sin_zero[7] = '\0';
      }
    }
    else {
      addr.sin_zero[4] = '\x02';
      addr.sin_zero[5] = '\0';
      addr.sin_zero[6] = '\0';
      addr.sin_zero[7] = '\0';
    }
  }
  else {
    addr.sin_zero[4] = '\x01';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
  }
  mbedtls_net_free((mbedtls_net_context *)addr.sin_zero);
  mbedtls_ssl_free((mbedtls_ssl_context *)&conf.max_major_ver);
  mbedtls_ssl_config_free((mbedtls_ssl_config *)local_ad8);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4));
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_x509_crt_free((mbedtls_x509_crt *)&entropy.source[0x13].strong);
  iVar1._0_1_ = addr.sin_zero[4];
  iVar1._1_1_ = addr.sin_zero[5];
  iVar1._2_1_ = addr.sin_zero[6];
  iVar1._3_1_ = addr.sin_zero[7];
  return iVar1;
}

Assistant:

int main( void )
{
    int ret = exit_ok;
    mbedtls_net_context server_fd;
    struct sockaddr_in addr;
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    mbedtls_x509_crt ca;
#endif

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * 0. Initialize and setup stuff
     */
    mbedtls_net_init( &server_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    mbedtls_x509_crt_init( &ca );
#endif

    mbedtls_entropy_init( &entropy );
    if( mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                       (const unsigned char *) pers, strlen( pers ) ) != 0 )
    {
        ret = ctr_drbg_seed_failed;
        goto exit;
    }

    if( mbedtls_ssl_config_defaults( &conf,
                MBEDTLS_SSL_IS_CLIENT,
                MBEDTLS_SSL_TRANSPORT_STREAM,
                MBEDTLS_SSL_PRESET_DEFAULT ) != 0 )
    {
        ret = ssl_config_defaults_failed;
        goto exit;
    }

    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    mbedtls_ssl_conf_psk( &conf, psk, sizeof( psk ),
                (const unsigned char *) psk_id, sizeof( psk_id ) - 1 );
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( mbedtls_x509_crt_parse_der( &ca, ca_cert, sizeof( ca_cert ) ) != 0 )
    {
        ret = x509_crt_parse_failed;
        goto exit;
    }

    mbedtls_ssl_conf_ca_chain( &conf, &ca, NULL );
    mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_REQUIRED );
#endif

    if( mbedtls_ssl_setup( &ssl, &conf ) != 0 )
    {
        ret = ssl_setup_failed;
        goto exit;
    }

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( mbedtls_ssl_set_hostname( &ssl, HOSTNAME ) != 0 )
    {
        ret = hostname_failed;
        goto exit;
    }
#endif

    /*
     * 1. Start the connection
     */
    memset( &addr, 0, sizeof( addr ) );
    addr.sin_family = AF_INET;

    ret = 1; /* for endianness detection */
    addr.sin_port = *((char *) &ret) == ret ? PORT_LE : PORT_BE;
    addr.sin_addr.s_addr = *((char *) &ret) == ret ? ADDR_LE : ADDR_BE;
    ret = 0;

    if( ( server_fd.fd = socket( AF_INET, SOCK_STREAM, 0 ) ) < 0 )
    {
        ret = socket_failed;
        goto exit;
    }

    if( connect( server_fd.fd,
                (const struct sockaddr *) &addr, sizeof( addr ) ) < 0 )
    {
        ret = connect_failed;
        goto exit;
    }

    mbedtls_ssl_set_bio( &ssl, &server_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

    if( mbedtls_ssl_handshake( &ssl ) != 0 )
    {
        ret = ssl_handshake_failed;
        goto exit;
    }

    /*
     * 2. Write the GET request and close the connection
     */
    if( mbedtls_ssl_write( &ssl, (const unsigned char *) GET_REQUEST,
                         sizeof( GET_REQUEST ) - 1 ) <= 0 )
    {
        ret = ssl_write_failed;
        goto exit;
    }

    mbedtls_ssl_close_notify( &ssl );

exit:
    mbedtls_net_free( &server_fd );

    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    mbedtls_x509_crt_free( &ca );
#endif

    return( ret );
}